

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void NGA_Access_block64(int g_a,int64_t idx,void *ptr,int64_t *ld)

{
  Integer IVar1;
  int64_t *piVar2;
  Integer _ga_work [7];
  int64_t local_68 [7];
  
  piVar2 = local_68;
  IVar1 = pnga_ndim((long)g_a);
  pnga_access_block_ptr((long)g_a,idx,ptr,local_68);
  if (1 < IVar1) {
    do {
      ld[IVar1 + -2] = *piVar2;
      IVar1 = IVar1 + -1;
      piVar2 = piVar2 + 1;
    } while (IVar1 != 1);
  }
  return;
}

Assistant:

void NGA_Access_block64(int g_a, int64_t idx, void *ptr, int64_t ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer iblock = (Integer)idx;
     Integer _ga_work[MAXDIM];
     wnga_access_block_ptr(a,iblock,ptr,_ga_work);
     COPYF2C_64(_ga_work,ld, ndim-1);
}